

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O1

void __thiscall entityx::BaseReceiver::~BaseReceiver(BaseReceiver *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Hash_node_base *connection;
  _Atomic_word *p_Var3;
  int iVar4;
  _Hash_node_base *this_00;
  _Hash_node_base *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar6;
  
  this->_vptr_BaseReceiver = (_func_int **)&PTR__BaseReceiver_001d2a98;
  p_Var5 = (this->connections_)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      this_00 = p_Var5[2]._M_nxt;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[3]._M_nxt;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        }
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        connection = p_Var5[4]._M_nxt;
        if (p_Var2->_M_use_count != 0) {
          this_01 = p_Var2;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            iVar4 = p_Var2->_M_use_count;
            do {
              if (iVar4 == 0) {
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                break;
              }
              LOCK();
              iVar1 = p_Var2->_M_use_count;
              bVar6 = iVar4 == iVar1;
              if (bVar6) {
                p_Var2->_M_use_count = iVar4 + 1;
                iVar1 = iVar4;
              }
              iVar4 = iVar1;
              UNLOCK();
            } while (!bVar6);
          }
          if (this_01->_M_use_count == 0) {
            this_00 = (_Hash_node_base *)0x0;
          }
          Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          disconnect((ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)
                     this_00,(size_t)connection);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3 = &p_Var2->_M_weak_count;
            iVar4 = *p_Var3;
            *p_Var3 = *p_Var3 + -1;
            UNLOCK();
          }
          else {
            iVar4 = p_Var2->_M_weak_count;
            p_Var2->_M_weak_count = iVar4 + -1;
          }
          if (iVar4 == 1) {
            (*(code *)((_Hash_node_base *)p_Var2->_vptr__Sp_counted_base)[3]._M_nxt)(p_Var2);
          }
        }
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  Catch::clara::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->connections_)._M_h);
  return;
}

Assistant:

virtual ~BaseReceiver() {
    for (auto connection : connections_) {
      auto &ptr = connection.second.first;
      if (!ptr.expired()) {
        ptr.lock()->disconnect(connection.second.second);
      }
    }
  }